

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O2

void get_bonuses(void)

{
  uint32_t *puVar1;
  int16_t *piVar2;
  player *ppVar3;
  
  ppVar3 = player;
  puVar1 = &player->upkeep->update;
  *puVar1 = *puVar1 | 5;
  update_stuff(ppVar3);
  ppVar3 = player;
  piVar2 = &player->msp;
  player->chp = player->mhp;
  ppVar3->csp = *piVar2;
  return;
}

Assistant:

static void get_bonuses(void)
{
	/* Calculate the bonuses and hitpoints */
	player->upkeep->update |= (PU_BONUS | PU_HP);

	/* Update stuff */
	update_stuff(player);

	/* Fully healed */
	player->chp = player->mhp;

	/* Fully rested */
	player->csp = player->msp;
}